

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void getV2f(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs,
           _func_void_char_ptr_V2f_ptr *check)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  Vec2 *pVVar3;
  invalid_argument *this;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  allocator<char> local_a1;
  V2f local_a0;
  long *local_98;
  long local_90;
  long local_88 [2];
  SetAttr local_78;
  undefined1 local_48 [16];
  
  if (*i <= argc + -3) {
    dVar2 = strtod(argv[(long)*i + 1],(char **)0x0);
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = dVar2;
    local_48._12_4_ = extraout_XMM0_Dd;
    dVar2 = strtod(argv[(long)*i + 2],(char **)0x0);
    local_a0.y = (float)dVar2;
    local_a0.x = (float)(double)local_48._0_8_;
    if (check != (_func_void_char_ptr_V2f_ptr *)0x0) {
      (*check)(attrName,&local_a0);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,attrName,&local_a1);
    pVVar3 = (Vec2 *)operator_new(0x10);
    Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>>::TypedAttribute(pVVar3);
    paVar1 = &local_78.name.field_2;
    local_78.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_98,local_90 + (long)local_98);
    local_78.part = part;
    local_78.attr = (Attribute *)pVVar3;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.name._M_dataplus._M_p,local_78.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    *i = *i + 3;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected two floats");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getV2f (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs,
    void (*check) (const char attrName[], const V2f& v) = 0)
{
    if (i > argc - 3) throw invalid_argument ("Expected two floats");

    V2f v (
        static_cast<float> (strtod (argv[i + 1], 0)),
        static_cast<float> (strtod (argv[i + 2], 0)));

    if (check) check (attrName, v);

    attrs.push_back (SetAttr (attrName, part, new V2fAttribute (v)));
    i += 3;
}